

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyBuildTLASAttribs(BuildTLASAttribs *Attribs,RayTracingProperties *RTProps)

{
  Uint64 *pUVar1;
  Bool BVar2;
  uint uVar3;
  Uint32 UVar4;
  RayTracingProperties *pRVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char (*in_RCX) [97];
  char (*Args_1) [60];
  char (*Args_1_00) [121];
  ulong extraout_RDX;
  char (*in_R9) [123];
  TLASBuildInstanceData *pTVar9;
  uint uVar10;
  char (*Args_3) [36];
  ulong uVar11;
  string msg;
  Uint32 PrevInstanceCount;
  char (*in_stack_ffffffffffffff80) [50];
  string local_78;
  ulong local_58;
  Uint32 *local_50;
  ulong local_48;
  long local_40;
  RayTracingProperties *local_38;
  long lVar8;
  
  if (Attribs->pTLAS == (ITopLevelAS *)0x0) {
    FormatString<char[33],char[24]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pTLAS must not be null.",(char (*) [24])in_RCX);
    in_RCX = (char (*) [97])0x32b;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->pScratchBuffer == (IBuffer *)0x0) {
    FormatString<char[33],char[33]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pScratchBuffer must not be null.",(char (*) [33])in_RCX);
    in_RCX = (char (*) [97])0x32c;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->pInstances == (TLASBuildInstanceData *)0x0) {
    FormatString<char[33],char[29]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstances must not be null.",(char (*) [29])in_RCX);
    in_RCX = (char (*) [97])0x32d;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->pInstanceBuffer == (IBuffer *)0x0) {
    FormatString<char[33],char[34]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer must not be null.",(char (*) [34])in_RCX);
    in_RCX = (char (*) [97])0x32e;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x32e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((Attribs->BindingMode != HIT_GROUP_BINDING_MODE_LAST) && (Attribs->HitGroupStride == 0)) {
    FormatString<char[33],char[97]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "HitGroupStride must be greater than 0 if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED."
               ,in_RCX);
    in_RCX = (char (*) [97])0x331;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x331);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  local_50 = &Attribs->InstanceCount;
  if (*(uint *)(lVar8 + 8) < Attribs->InstanceCount) {
    in_R9 = (char (*) [123])(lVar8 + 8);
    FormatString<char[33],char[16],unsigned_int,char[68],unsigned_int,char[3]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",(char (*) [33])0x76aace,
               (char (*) [16])local_50,
               (uint *)") must be less than or equal to pTLAS->GetDesc().MaxInstanceCount (",
               (char (*) [68])in_R9,(uint *)0x773e90,(char (*) [3])in_stack_ffffffffffffff80);
    in_RCX = (char (*) [97])0x337;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x337);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->Update == true) {
    if ((*(byte *)(lVar8 + 0xc) & 1) == 0) {
      FormatString<char[33],char[80]>
                (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])
                 "Update is true, but TLAS created without RAYTRACING_BUILD_AS_ALLOW_UPDATE flag.",
                 (char (*) [80])in_RCX);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p)
                 ,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x33c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[9])(&local_78);
    local_58 = CONCAT44(local_58._4_4_,(Uint32)local_78._M_dataplus._M_p);
    if ((Uint32)local_78._M_dataplus._M_p != Attribs->InstanceCount) {
      in_R9 = (char (*) [123])&local_58;
      FormatString<char[33],char[36],unsigned_int,char[38],unsigned_int,char[3]>
                (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
                 (char (*) [33])"Update is true, but InstanceCount (",(char (*) [36])local_50,
                 (uint *)") does not match the previous value (",(char (*) [38])in_R9,
                 (uint *)0x773e90,(char (*) [3])in_stack_ffffffffffffff80);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p)
                 ,"VerifyBuildTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
  }
  local_38 = RTProps;
  iVar6 = (*(Attribs->pInstanceBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  local_40 = CONCAT44(extraout_var_00,iVar6);
  uVar3 = Attribs->InstanceCount;
  local_48 = (ulong)uVar3;
  local_58 = local_58 & 0xffffffff00000000;
  if (local_48 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    uVar7 = 0;
    do {
      pTVar9 = Attribs->pInstances;
      if (0xffffff < pTVar9[uVar7].CustomId) {
        FormatString<char[33]>(&local_78,(char (*) [33])"Only the lower 24 bits are used.");
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                    (Uint32)local_78._M_dataplus._M_p),"VerifyBuildTLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x34d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p
                                  ),local_78.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar9 = pTVar9 + uVar7;
      if (0x1000000 < pTVar9->ContributionToHitGroupIndex + 1) {
        FormatString<char[33]>(&local_78,(char (*) [33])"Only the lower 24 bits are used.");
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                    (Uint32)local_78._M_dataplus._M_p),"VerifyBuildTLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x351);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p
                                  ),local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (pTVar9->InstanceName == (Char *)0x0) {
        FormatString<char[33],char[12],unsigned_int,char[33]>
                  (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",(char (*) [33])0x76ab4e,
                   (char (*) [12])&local_58,(uint *)"].InstanceName must not be null.",
                   (char (*) [33])in_R9);
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                    (Uint32)local_78._M_dataplus._M_p),"VerifyBuildTLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x353);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p
                                  ),local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (pTVar9->pBLAS == (IBottomLevelAS *)0x0) {
        FormatString<char[33],char[12],unsigned_int,char[26]>
                  (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",(char (*) [33])0x76ab4e,
                   (char (*) [12])&local_58,(uint *)"].pBLAS must not be null.",(char (*) [26])in_R9
                  );
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                    (Uint32)local_78._M_dataplus._M_p),"VerifyBuildTLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x354);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p
                                  ),local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if ((Attribs->Update == true) &&
         (iVar6 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[8])
                            (Attribs->pTLAS,pTVar9->InstanceName),
         0xfffffffeffffffff < CONCAT44(extraout_var_01,iVar6))) {
        FormatString<char[33],char[32],unsigned_int,char[32]>
                  (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
                   (char (*) [33])"Update is true, but pInstances[",(char (*) [32])&local_58,
                   (uint *)"].InstanceName does not exists.",(char (*) [32])in_R9);
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                    (Uint32)local_78._M_dataplus._M_p),"VerifyBuildTLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x359);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p
                                  ),local_78.field_2._M_allocated_capacity + 1);
        }
      }
      UVar4 = pTVar9->ContributionToHitGroupIndex;
      if ((Attribs->BindingMode != HIT_GROUP_BINDING_MODE_LAST) && (UVar4 != 0xffffffff)) {
        FormatString<char[33],char[12],unsigned_int,char[123]>
                  (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",(char (*) [33])0x76ab4e,
                   (char (*) [12])&local_58,
                   (uint *)
                   "].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED."
                   ,in_R9);
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                    (Uint32)local_78._M_dataplus._M_p),"VerifyBuildTLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x362);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p
                                  ),local_78.field_2._M_allocated_capacity + 1);
        }
      }
      uVar10 = uVar10 + (UVar4 == 0xffffffff);
      uVar7 = (int)local_58 + 1;
      local_58 = CONCAT44(local_58._4_4_,uVar7);
      uVar3 = *local_50;
    } while (uVar7 < uVar3);
  }
  pRVar5 = local_38;
  lVar8 = local_40;
  if (uVar10 != uVar3 && uVar10 != 0) {
    FormatString<char[33],char[105]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "all pInstances[i].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO, or none of them should."
               ,(char (*) [105])(ulong)CONCAT31((int3)(uVar3 >> 8),uVar10 == uVar3 || uVar10 == 0));
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x366);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &Attribs->InstanceBufferOffset;
  Args_3 = (char (*) [36])(lVar8 + 8);
  if (*(ulong *)(lVar8 + 8) < Attribs->InstanceBufferOffset) {
    FormatString<char[33],char[23],unsigned_long,char[36],unsigned_long,char[3]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"InstanceBufferOffset (",(char (*) [23])pUVar1,
               (unsigned_long *)") is greater than the buffer size (",Args_3,
               (unsigned_long *)0x773e90,(char (*) [3])in_stack_ffffffffffffff80);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x369);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)*Args_3 - *pUVar1 < local_48 * 0x40) {
    local_58 = *pUVar1 + local_48 * 0x40;
    FormatString<char[33],char[23],unsigned_long,char[26],unsigned_long,char[21]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer size (",(char (*) [23])Args_3,
               (unsigned_long *)") is too small: at least ",(char (*) [26])&local_58,
               (unsigned_long *)" bytes are required.",(char (*) [21])in_stack_ffffffffffffff80);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x36d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  Args_1 = (char (*) [60])(ulong)pRVar5->InstanceBufferAlignment;
  if (*pUVar1 % (ulong)Args_1 != 0) {
    FormatString<char[33],char[23],unsigned_long,char[22],unsigned_int,char[50]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"InstanceBufferOffset (",(char (*) [23])pUVar1,
               (unsigned_long *)") must be aligned by ",
               (char (*) [22])&pRVar5->InstanceBufferAlignment,
               (uint *)" (RayTracingProperties::InstanceBufferAlignment).",in_stack_ffffffffffffff80
              );
    Args_1 = (char (*) [60])0x371;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x371);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((*(byte *)(lVar8 + 0x11) & 4) == 0) {
    FormatString<char[33],char[60]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pInstanceBuffer was not created with BIND_RAY_TRACING flag.",Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x374);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*(Attribs->pScratchBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar8 = CONCAT44(extraout_var_02,iVar6);
  pUVar1 = &Attribs->ScratchBufferOffset;
  if (*(ulong *)(lVar8 + 8) < Attribs->ScratchBufferOffset) {
    FormatString<char[33],char[22],unsigned_long,char[36],unsigned_long,char[3]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"ScratchBufferOffset (",(char (*) [22])pUVar1,
               (unsigned_long *)") is greater than the buffer size (",(char (*) [36])(lVar8 + 8),
               (unsigned_long *)0x773e90,(char (*) [3])in_stack_ffffffffffffff80);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x379);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  Args_1_00 = (char (*) [121])(ulong)pRVar5->ScratchBufferAlignment;
  if (*pUVar1 % (ulong)Args_1_00 != 0) {
    FormatString<char[33],char[22],unsigned_long,char[22],unsigned_int,char[49]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"ScratchBufferOffset (",(char (*) [22])pUVar1,
               (unsigned_long *)") must be aligned by ",
               (char (*) [22])&pRVar5->ScratchBufferAlignment,
               (uint *)" (RayTracingProperties::ScratchBufferAlignment).",
               (char (*) [49])in_stack_ffffffffffffff80);
    Args_1_00 = (char (*) [121])0x37d;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x37d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  BVar2 = Attribs->Update;
  uVar11 = *(long *)*(char (*) [36])(lVar8 + 8) - Attribs->ScratchBufferOffset;
  iVar6 = (*(Attribs->pTLAS->super_IDeviceObject).super_IObject._vptr_IObject[10])();
  if (BVar2 == true) {
    if (extraout_RDX <= uVar11) goto LAB_0047d488;
    FormatString<char[33],char[121]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Update to get the required size for scratch buffer."
               ,Args_1_00);
    Args_1_00 = (char (*) [121])0x382;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x382);
  }
  else {
    if (CONCAT44(extraout_var_03,iVar6) <= uVar11) goto LAB_0047d488;
    FormatString<char[33],char[120]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])
               "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Build to get the required size for scratch buffer."
               ,(char (*) [120])Args_1_00);
    Args_1_00 = (char (*) [121])0x387;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x387);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                    local_78.field_2._M_allocated_capacity + 1);
  }
LAB_0047d488:
  if ((*(byte *)(lVar8 + 0x11) & 4) == 0) {
    FormatString<char[33],char[59]>
              (&local_78,(Diligent *)"Build TLAS attribs are invalid: ",
               (char (*) [33])"pScratchBuffer was not created with BIND_RAY_TRACING flag.",
               (char (*) [59])Args_1_00);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
               "VerifyBuildTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x38b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(Uint32)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyBuildTLASAttribs(const BuildTLASAttribs& Attribs, const RayTracingProperties& RTProps)
{
#define CHECK_BUILD_TLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Build TLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pTLAS != nullptr, "pTLAS must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pScratchBuffer != nullptr, "pScratchBuffer must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pInstances != nullptr, "pInstances must not be null.");
    CHECK_BUILD_TLAS_ATTRIBS(Attribs.pInstanceBuffer != nullptr, "pInstanceBuffer must not be null.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED || Attribs.HitGroupStride != 0,
                             "HitGroupStride must be greater than 0 if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED.");

    const TopLevelASDesc& TLASDesc = Attribs.pTLAS->GetDesc();

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceCount <= TLASDesc.MaxInstanceCount,
                             "InstanceCount (", Attribs.InstanceCount, ") must be less than or equal to pTLAS->GetDesc().MaxInstanceCount (",
                             TLASDesc.MaxInstanceCount, ").");

    if (Attribs.Update)
    {
        CHECK_BUILD_TLAS_ATTRIBS((TLASDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_UPDATE) == RAYTRACING_BUILD_AS_ALLOW_UPDATE,
                                 "Update is true, but TLAS created without RAYTRACING_BUILD_AS_ALLOW_UPDATE flag.");

        const Uint32 PrevInstanceCount = Attribs.pTLAS->GetBuildInfo().InstanceCount;
        CHECK_BUILD_TLAS_ATTRIBS(PrevInstanceCount == Attribs.InstanceCount,
                                 "Update is true, but InstanceCount (", Attribs.InstanceCount, ") does not match the previous value (", PrevInstanceCount, ").");
    }

    const BufferDesc& InstDesc          = Attribs.pInstanceBuffer->GetDesc();
    const size_t      InstDataSize      = size_t{Attribs.InstanceCount} * size_t{TLAS_INSTANCE_DATA_SIZE};
    Uint32            AutoOffsetCounter = 0;

    // Calculate instance data size
    for (Uint32 i = 0; i < Attribs.InstanceCount; ++i)
    {
        constexpr Uint32             BitMask = (1u << 24) - 1;
        const TLASBuildInstanceData& Inst    = Attribs.pInstances[i];

        VERIFY((Inst.CustomId & ~BitMask) == 0, "Only the lower 24 bits are used.");

        VERIFY(Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO ||
                   (Inst.ContributionToHitGroupIndex & ~BitMask) == 0,
               "Only the lower 24 bits are used.");

        CHECK_BUILD_TLAS_ATTRIBS(Inst.InstanceName != nullptr, "pInstances[", i, "].InstanceName must not be null.");
        CHECK_BUILD_TLAS_ATTRIBS(Inst.pBLAS != nullptr, "pInstances[", i, "].pBLAS must not be null.");

        if (Attribs.Update)
        {
            const TLASInstanceDesc IDesc = Attribs.pTLAS->GetInstanceDesc(Inst.InstanceName);
            CHECK_BUILD_TLAS_ATTRIBS(IDesc.InstanceIndex != INVALID_INDEX, "Update is true, but pInstances[", i, "].InstanceName does not exists.");
        }

        if (Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO)
            ++AutoOffsetCounter;

        CHECK_BUILD_TLAS_ATTRIBS(Attribs.BindingMode == HIT_GROUP_BINDING_MODE_USER_DEFINED || Inst.ContributionToHitGroupIndex == TLAS_INSTANCE_OFFSET_AUTO,
                                 "pInstances[", i,
                                 "].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO "
                                 "if BindingMode is not HIT_GROUP_BINDING_MODE_USER_DEFINED.");
    }

    CHECK_BUILD_TLAS_ATTRIBS(AutoOffsetCounter == 0 || AutoOffsetCounter == Attribs.InstanceCount,
                             "all pInstances[i].ContributionToHitGroupIndex must be TLAS_INSTANCE_OFFSET_AUTO, or none of them should.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceBufferOffset <= InstDesc.Size,
                             "InstanceBufferOffset (", Attribs.InstanceBufferOffset, ") is greater than the buffer size (", InstDesc.Size, ").");

    CHECK_BUILD_TLAS_ATTRIBS(InstDesc.Size - Attribs.InstanceBufferOffset >= InstDataSize,
                             "pInstanceBuffer size (", InstDesc.Size, ") is too small: at least ",
                             InstDataSize + Attribs.InstanceBufferOffset, " bytes are required.");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.InstanceBufferOffset % RTProps.InstanceBufferAlignment == 0,
                             "InstanceBufferOffset (", Attribs.InstanceBufferOffset, ") must be aligned by ", RTProps.InstanceBufferAlignment,
                             " (RayTracingProperties::InstanceBufferAlignment).");

    CHECK_BUILD_TLAS_ATTRIBS((InstDesc.BindFlags & BIND_RAY_TRACING) == BIND_RAY_TRACING,
                             "pInstanceBuffer was not created with BIND_RAY_TRACING flag.");

    const BufferDesc& ScratchDesc = Attribs.pScratchBuffer->GetDesc();

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.ScratchBufferOffset <= ScratchDesc.Size,
                             "ScratchBufferOffset (", Attribs.ScratchBufferOffset, ") is greater than the buffer size (", ScratchDesc.Size, ").");

    CHECK_BUILD_TLAS_ATTRIBS(Attribs.ScratchBufferOffset % RTProps.ScratchBufferAlignment == 0,
                             "ScratchBufferOffset (", Attribs.ScratchBufferOffset, ") must be aligned by ", RTProps.ScratchBufferAlignment,
                             " (RayTracingProperties::ScratchBufferAlignment).");

    if (Attribs.Update)
    {
        CHECK_BUILD_TLAS_ATTRIBS(ScratchDesc.Size - Attribs.ScratchBufferOffset >= Attribs.pTLAS->GetScratchBufferSizes().Update,
                                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Update to get the required size for scratch buffer.");
    }
    else
    {
        CHECK_BUILD_TLAS_ATTRIBS(ScratchDesc.Size - Attribs.ScratchBufferOffset >= Attribs.pTLAS->GetScratchBufferSizes().Build,
                                 "pScratchBuffer size is too small, use pTLAS->GetScratchBufferSizes().Build to get the required size for scratch buffer.");
    }

    CHECK_BUILD_TLAS_ATTRIBS((ScratchDesc.BindFlags & BIND_RAY_TRACING) == BIND_RAY_TRACING,
                             "pScratchBuffer was not created with BIND_RAY_TRACING flag.");
#undef CHECK_BUILD_TLAS_ATTRIBS

    return true;
}